

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# primitive_field.cc
# Opt level: O2

void __thiscall
google::protobuf::compiler::cpp::anon_unknown_4::RepeatedPrimitive::
GenerateSerializeWithCachedSizesToArray(RepeatedPrimitive *this,Printer *p)

{
  bool bVar1;
  char *pcVar2;
  undefined8 uVar3;
  optional<unsigned_long> oVar4;
  allocator<char> local_121;
  char *local_120;
  size_type local_118;
  char local_110 [8];
  undefined8 uStack_108;
  Printer *p_local;
  _Any_data local_f8;
  code *local_e8;
  code *pcStack_e0;
  undefined1 local_d8 [64];
  __index_type local_98;
  _Alloc_hider local_90;
  size_type local_88;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_80;
  bool local_70;
  bool local_28;
  
  p_local = p;
  bVar1 = FieldDescriptor::is_packed((this->super_FieldGeneratorBase).field_);
  if (bVar1) {
    oVar4 = FixedSize((uint)((this->super_FieldGeneratorBase).field_)->type_);
    if (((undefined1  [16])
         oVar4.super__Optional_base<unsigned_long,_true,_true>._M_payload.
         super__Optional_payload_base<unsigned_long> & (undefined1  [16])0x1) ==
        (undefined1  [16])0x0) {
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_120,"byte_size",&local_121);
      local_d8._0_8_ = local_d8 + 0x10;
      if (local_120 == local_110) {
        local_d8._24_8_ = uStack_108;
      }
      else {
        local_d8._0_8_ = local_120;
      }
      local_d8._8_8_ = local_118;
      local_118 = 0;
      local_110[0] = '\0';
      local_e8 = (code *)0x0;
      pcStack_e0 = (code *)0x0;
      local_f8._M_unused._M_object = (void *)0x0;
      local_f8._8_8_ = 0;
      local_120 = local_110;
      local_f8._M_unused._M_object = operator_new(0x18);
      *(RepeatedPrimitive **)local_f8._M_unused._0_8_ = this;
      *(Printer ***)((long)local_f8._M_unused._0_8_ + 8) = &p_local;
      *(code *)((long)local_f8._M_unused._0_8_ + 0x10) = (code)0x0;
      pcStack_e0 = std::
                   _Function_handler<bool_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/io/printer.h:931:7)>
                   ::_M_invoke;
      local_e8 = std::
                 _Function_handler<bool_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/io/printer.h:931:7)>
                 ::_M_manager;
      std::variant<std::__cxx11::string,std::function<bool()>>::
      variant<std::function<bool()>,void,void,std::function<bool()>,void>
                ((variant<std::__cxx11::string,std::function<bool()>> *)(local_d8 + 0x20),
                 (function<bool_()> *)&local_f8);
      std::_Function_base::~_Function_base((_Function_base *)&local_f8);
      local_90._M_p = (pointer)&local_80;
      local_88 = 0;
      local_80._M_local_buf[0] = '\0';
      local_70 = false;
      if (local_98 == '\x01') {
        std::__cxx11::string::assign((char *)&local_90);
      }
      local_28 = false;
      io::Printer::Emit(p,local_d8,1,0xed,
                        "\n        {\n          int byte_size = $byte_size$;\n          if (byte_size > 0) {\n            target = stream->Write$DeclaredType$Packed(\n                $number$, this_._internal_$name$(), byte_size, target);\n          }\n        }\n      "
                       );
      io::Printer::Sub::~Sub((Sub *)local_d8);
      std::__cxx11::string::~string((string *)&local_120);
      return;
    }
    pcVar2 = 
    "\n      if (this_._internal_$name$_size() > 0) {\n        target = stream->WriteFixedPacked($number$, this_._internal_$name$(), target);\n      }\n    "
    ;
    uVar3 = 0x93;
  }
  else {
    pcVar2 = 
    "\n      for (int i = 0, n = this_._internal_$name$_size(); i < n; ++i) {\n        target = stream->EnsureSpace(target);\n        target = ::_pbi::WireFormatLite::Write$DeclaredType$ToArray(\n            $number$, this_._internal_$name$().Get(i), target);\n      }\n    "
    ;
    uVar3 = 0x107;
  }
  io::Printer::Emit(p,uVar3,pcVar2);
  return;
}

Assistant:

void RepeatedPrimitive::GenerateSerializeWithCachedSizesToArray(
    io::Printer* p) const {
  if (!field_->is_packed()) {
    p->Emit(R"cc(
      for (int i = 0, n = this_._internal_$name$_size(); i < n; ++i) {
        target = stream->EnsureSpace(target);
        target = ::_pbi::WireFormatLite::Write$DeclaredType$ToArray(
            $number$, this_._internal_$name$().Get(i), target);
      }
    )cc");
    return;
  }

  if (FixedSize(field_->type()).has_value()) {
    p->Emit(R"cc(
      if (this_._internal_$name$_size() > 0) {
        target = stream->WriteFixedPacked($number$, this_._internal_$name$(), target);
      }
    )cc");
    return;
  }

  p->Emit(
      {
          {"byte_size",
           [&] {
             if (HasCachedSize()) {
               p->Emit(R"cc(this_.$_field_cached_byte_size_$.Get();)cc");
             } else {
               p->Emit(R"cc(
                 ::_pbi::WireFormatLite::$DeclaredType$Size(
                     this_._internal_$name$());
               )cc");
             }
           }},
      },
      R"cc(
        {
          int byte_size = $byte_size$;
          if (byte_size > 0) {
            target = stream->Write$DeclaredType$Packed(
                $number$, this_._internal_$name$(), byte_size, target);
          }
        }
      )cc");
}